

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

bool units::precise::custom::is_custom_unit_inverted(unit_data *UT)

{
  int iVar1;
  unit_data *in_RDI;
  int key;
  bool local_1;
  
  iVar1 = units::detail::unit_data::meter(in_RDI);
  if (iVar1 < 0) {
    return true;
  }
  if (0 < iVar1) {
    return false;
  }
  iVar1 = units::detail::unit_data::kg(in_RDI);
  if (iVar1 + 3U < 2) {
LAB_006d5add:
    local_1 = false;
  }
  else {
    if (iVar1 != -1) {
      if (iVar1 == 1) goto LAB_006d5add;
      if (1 < iVar1 - 2U) {
        iVar1 = units::detail::unit_data::second(in_RDI);
        if (iVar1 + 7U < 2) {
          return true;
        }
        if (iVar1 != -1) {
          if (iVar1 == 1) {
            return true;
          }
          if (1 < iVar1 - 6U) {
            iVar1 = units::detail::unit_data::ampere(in_RDI);
            return iVar1 == 3;
          }
        }
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool is_custom_unit_inverted(const detail::unit_data& UT)
        {
            int key = UT.meter();
            if (key < 0) {
                return true;
            }
            if (key > 0) {
                return false;
            }
            key = UT.kg();
            switch (key) {
                case 1:
                case -2:
                case -3:
                    return false;
                case -1:
                case 2:
                case 3:
                    return true;
                default:
                    break;
            }
            key = UT.second();
            switch (key) {
                case 1:
                case -7:
                case -6:
                    return true;
                case -1:
                case 7:
                case 6:
                    return false;
                default:
                    break;
            }
            return (UT.ampere() == 3);
        }